

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O2

void Translate(ExpressionTranslateContext *ctx,ExprBase *expression)

{
  undefined8 in_RAX;
  undefined8 in_RDX;
  
  if (expression != (ExprBase *)0x0) {
    switch(expression->typeID) {
    case 2:
      Print(ctx,"/*void*/",in_RDX,in_RAX);
      return;
    case 3:
      TranslateBoolLiteral(ctx,(ExprBoolLiteral *)expression);
      return;
    case 4:
      TranslateCharacterLiteral(ctx,(ExprCharacterLiteral *)expression);
      return;
    case 5:
      TranslateStringLiteral(ctx,(ExprStringLiteral *)expression);
      return;
    case 6:
      TranslateIntegerLiteral(ctx,(ExprIntegerLiteral *)expression);
      return;
    case 7:
      TranslateRationalLiteral(ctx,(ExprRationalLiteral *)expression);
      return;
    case 8:
      TranslateTypeLiteral(ctx,(ExprTypeLiteral *)expression);
      return;
    case 9:
      TranslateNullptrLiteral(ctx,(ExprNullptrLiteral *)expression);
      return;
    case 10:
      TranslateFunctionIndexLiteral(ctx,(ExprFunctionIndexLiteral *)expression);
      return;
    case 0xe:
      TranslatePassthrough(ctx,(ExprPassthrough *)expression);
      return;
    case 0xf:
      TranslateArray(ctx,(ExprArray *)expression);
      return;
    case 0x10:
      TranslatePreModify(ctx,(ExprPreModify *)expression);
      return;
    case 0x11:
      TranslatePostModify(ctx,(ExprPostModify *)expression);
      return;
    case 0x12:
      TranslateCast(ctx,(ExprTypeCast *)expression);
      return;
    case 0x13:
      TranslateUnaryOp(ctx,(ExprUnaryOp *)expression);
      return;
    case 0x14:
      TranslateBinaryOp(ctx,(ExprBinaryOp *)expression);
      return;
    case 0x15:
      TranslateGetAddress(ctx,(ExprGetAddress *)expression);
      return;
    case 0x16:
      TranslateDereference(ctx,(ExprDereference *)expression);
      return;
    case 0x17:
      TranslateUnboxing(ctx,(ExprUnboxing *)expression);
      return;
    case 0x18:
      TranslateConditional(ctx,(ExprConditional *)expression);
      return;
    case 0x19:
      TranslateAssignment(ctx,(ExprAssignment *)expression);
      return;
    case 0x1a:
      TranslateMemberAccess(ctx,(ExprMemberAccess *)expression);
      return;
    case 0x1b:
      TranslateArrayIndex(ctx,(ExprArrayIndex *)expression);
      return;
    case 0x1c:
      TranslateReturn(ctx,(ExprReturn *)expression);
      return;
    case 0x1d:
      TranslateYield(ctx,(ExprYield *)expression);
      return;
    case 0x1e:
      TranslateVariableDefinition(ctx,(ExprVariableDefinition *)expression);
      return;
    case 0x1f:
      TranslateZeroInitialize(ctx,(ExprZeroInitialize *)expression);
      return;
    case 0x20:
      TranslateArraySetup(ctx,(ExprArraySetup *)expression);
      return;
    case 0x21:
      TranslateVariableDefinitions(ctx,(ExprVariableDefinitions *)expression);
      return;
    case 0x22:
      TranslateVariableAccess(ctx,(ExprVariableAccess *)expression);
      return;
    case 0x23:
      TranslateFunctionContextAccess(ctx,(ExprFunctionContextAccess *)expression);
      return;
    case 0x24:
      TranslateFunctionDefinition(ctx,(ExprFunctionDefinition *)expression);
      return;
    case 0x25:
      TranslateGenericFunctionPrototype(ctx,(ExprGenericFunctionPrototype *)expression);
      return;
    case 0x26:
      TranslateFunctionAccess(ctx,(ExprFunctionAccess *)expression);
      return;
    case 0x27:
      __assert_fail("!\"miscompiled tree\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                    ,0xb36,"void Translate(ExpressionTranslateContext &, ExprBase *)");
    case 0x28:
      __assert_fail("!\"miscompiled tree\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                    ,0xb38,"void Translate(ExpressionTranslateContext &, ExprBase *)");
    case 0x29:
      TranslateFunctionCall(ctx,(ExprFunctionCall *)expression);
      return;
    case 0x2a:
      TranslateAliasDefinition(ctx,(ExprAliasDefinition *)expression);
      return;
    case 0x2b:
      TranslateClassPrototype(ctx,(ExprClassPrototype *)expression);
      return;
    case 0x2c:
      TranslateGenericClassPrototype(ctx,(ExprGenericClassPrototype *)expression);
      return;
    case 0x2d:
      TranslateClassDefinition(ctx,(ExprClassDefinition *)expression);
      return;
    case 0x2e:
      TranslateEnumDefinition(ctx,(ExprEnumDefinition *)expression);
      return;
    case 0x2f:
      TranslateIfElse(ctx,(ExprIfElse *)expression);
      return;
    case 0x30:
      TranslateFor(ctx,(ExprFor *)expression);
      return;
    case 0x31:
      TranslateWhile(ctx,(ExprWhile *)expression);
      return;
    case 0x32:
      TranslateDoWhile(ctx,(ExprDoWhile *)expression);
      return;
    case 0x33:
      TranslateSwitch(ctx,(ExprSwitch *)expression);
      return;
    case 0x34:
      TranslateBreak(ctx,(ExprBreak *)expression);
      return;
    case 0x35:
      TranslateContinue(ctx,(ExprContinue *)expression);
      return;
    case 0x36:
      TranslateBlock(ctx,(ExprBlock *)expression);
      return;
    case 0x37:
      TranslateSequence(ctx,(ExprSequence *)expression);
      return;
    }
  }
  __assert_fail("!\"unknown type\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                ,0xb58,"void Translate(ExpressionTranslateContext &, ExprBase *)");
}

Assistant:

void Translate(ExpressionTranslateContext &ctx, ExprBase *expression)
{
	if(ExprVoid *expr = getType<ExprVoid>(expression))
		TranslateVoid(ctx, expr);
	else if(ExprBoolLiteral *expr = getType<ExprBoolLiteral>(expression))
		TranslateBoolLiteral(ctx, expr);
	else if(ExprCharacterLiteral *expr = getType<ExprCharacterLiteral>(expression))
		TranslateCharacterLiteral(ctx, expr);
	else if(ExprStringLiteral *expr = getType<ExprStringLiteral>(expression))
		TranslateStringLiteral(ctx, expr);
	else if(ExprIntegerLiteral *expr = getType<ExprIntegerLiteral>(expression))
		TranslateIntegerLiteral(ctx, expr);
	else if(ExprRationalLiteral *expr = getType<ExprRationalLiteral>(expression))
		TranslateRationalLiteral(ctx, expr);
	else if(ExprTypeLiteral *expr = getType<ExprTypeLiteral>(expression))
		TranslateTypeLiteral(ctx, expr);
	else if(ExprNullptrLiteral *expr = getType<ExprNullptrLiteral>(expression))
		TranslateNullptrLiteral(ctx, expr);
	else if(ExprFunctionIndexLiteral *expr = getType<ExprFunctionIndexLiteral>(expression))
		TranslateFunctionIndexLiteral(ctx, expr);
	else if(ExprPassthrough *expr = getType<ExprPassthrough>(expression))
		TranslatePassthrough(ctx, expr);
	else if(ExprArray *expr = getType<ExprArray>(expression))
		TranslateArray(ctx, expr);
	else if(ExprPreModify *expr = getType<ExprPreModify>(expression))
		TranslatePreModify(ctx, expr);
	else if(ExprPostModify *expr = getType<ExprPostModify>(expression))
		TranslatePostModify(ctx, expr);
	else if(ExprTypeCast *expr = getType<ExprTypeCast>(expression))
		TranslateCast(ctx, expr);
	else if(ExprUnaryOp *expr = getType<ExprUnaryOp>(expression))
		TranslateUnaryOp(ctx, expr);
	else if(ExprBinaryOp *expr = getType<ExprBinaryOp>(expression))
		TranslateBinaryOp(ctx, expr);
	else if(ExprGetAddress *expr = getType<ExprGetAddress>(expression))
		TranslateGetAddress(ctx, expr);
	else if(ExprDereference *expr = getType<ExprDereference>(expression))
		TranslateDereference(ctx, expr);
	else if(ExprUnboxing *expr = getType<ExprUnboxing>(expression))
		TranslateUnboxing(ctx, expr);
	else if(ExprConditional *expr = getType<ExprConditional>(expression))
		TranslateConditional(ctx, expr);
	else if(ExprAssignment *expr = getType<ExprAssignment>(expression))
		TranslateAssignment(ctx, expr);
	else if(ExprMemberAccess *expr = getType<ExprMemberAccess>(expression))
		TranslateMemberAccess(ctx, expr);
	else if(ExprArrayIndex *expr = getType<ExprArrayIndex>(expression))
		TranslateArrayIndex(ctx, expr);
	else if(ExprReturn *expr = getType<ExprReturn>(expression))
		TranslateReturn(ctx, expr);
	else if(ExprYield *expr = getType<ExprYield>(expression))
		TranslateYield(ctx, expr);
	else if(ExprVariableDefinition *expr = getType<ExprVariableDefinition>(expression))
		TranslateVariableDefinition(ctx, expr);
	else if(ExprZeroInitialize *expr = getType<ExprZeroInitialize>(expression))
		TranslateZeroInitialize(ctx, expr);
	else if(ExprArraySetup *expr = getType<ExprArraySetup>(expression))
		TranslateArraySetup(ctx, expr);
	else if(ExprVariableDefinitions *expr = getType<ExprVariableDefinitions>(expression))
		TranslateVariableDefinitions(ctx, expr);
	else if(ExprVariableAccess *expr = getType<ExprVariableAccess>(expression))
		TranslateVariableAccess(ctx, expr);
	else if(ExprFunctionContextAccess *expr = getType<ExprFunctionContextAccess>(expression))
		TranslateFunctionContextAccess(ctx, expr);
	else if(ExprFunctionDefinition *expr = getType<ExprFunctionDefinition>(expression))
		TranslateFunctionDefinition(ctx, expr);
	else if(ExprGenericFunctionPrototype *expr = getType<ExprGenericFunctionPrototype>(expression))
		TranslateGenericFunctionPrototype(ctx, expr);
	else if(ExprFunctionAccess *expr = getType<ExprFunctionAccess>(expression))
		TranslateFunctionAccess(ctx, expr);
	else if(isType<ExprFunctionOverloadSet>(expression))
		assert(!"miscompiled tree");
	else if(isType<ExprShortFunctionOverloadSet>(expression))
		assert(!"miscompiled tree");
	else if(ExprFunctionCall *expr = getType<ExprFunctionCall>(expression))
		TranslateFunctionCall(ctx, expr);
	else if(ExprAliasDefinition *expr = getType<ExprAliasDefinition>(expression))
		TranslateAliasDefinition(ctx, expr);
	else if(ExprClassPrototype *expr = getType<ExprClassPrototype>(expression))
		TranslateClassPrototype(ctx, expr);
	else if(ExprGenericClassPrototype *expr = getType<ExprGenericClassPrototype>(expression))
		TranslateGenericClassPrototype(ctx, expr);
	else if(ExprClassDefinition *expr = getType<ExprClassDefinition>(expression))
		TranslateClassDefinition(ctx, expr);
	else if(ExprEnumDefinition *expr = getType<ExprEnumDefinition>(expression))
		TranslateEnumDefinition(ctx, expr);
	else if(ExprIfElse *expr = getType<ExprIfElse>(expression))
		TranslateIfElse(ctx, expr);
	else if(ExprFor *expr = getType<ExprFor>(expression))
		TranslateFor(ctx, expr);
	else if(ExprWhile *expr = getType<ExprWhile>(expression))
		TranslateWhile(ctx, expr);
	else if(ExprDoWhile *expr = getType<ExprDoWhile>(expression))
		TranslateDoWhile(ctx, expr);
	else if(ExprSwitch *expr = getType<ExprSwitch>(expression))
		TranslateSwitch(ctx, expr);
	else if(ExprBreak *expr = getType<ExprBreak>(expression))
		TranslateBreak(ctx, expr);
	else if(ExprContinue *expr = getType<ExprContinue>(expression))
		TranslateContinue(ctx, expr);
	else if(ExprBlock *expr = getType<ExprBlock>(expression))
		TranslateBlock(ctx, expr);
	else if(ExprSequence *expr = getType<ExprSequence>(expression))
		TranslateSequence(ctx, expr);
	else
		assert(!"unknown type");
}